

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2latlng_rect.cc
# Opt level: O0

S2Point * S2LatLngRect::GetBisectorIntersection
                    (S2Point *__return_storage_ptr__,R1Interval *lat,double lng)

{
  int iVar1;
  S2LatLng SVar2;
  S2Point local_78;
  VType local_50;
  VType local_48;
  VType local_40;
  VType local_38;
  undefined1 local_30 [8];
  S2LatLng ortho_bisector;
  double lat_center;
  double lng_local;
  R1Interval *lat_local;
  
  ortho_bisector.coords_.c_[1] = R1Interval::GetCenter(lat);
  S2LatLng::S2LatLng((S2LatLng *)local_30);
  if (ortho_bisector.coords_.c_[1] < 0.0) {
    SVar2 = S2LatLng::FromRadians
                      (-ortho_bisector.coords_.c_[1] - 1.5707963267948966,
                       ABS(lng) - 3.141592653589793);
    local_50 = SVar2.coords_.c_[0];
    local_48 = SVar2.coords_.c_[1];
    local_30 = (undefined1  [8])local_50;
    ortho_bisector.coords_.c_[0] = local_48;
  }
  else {
    SVar2 = S2LatLng::FromRadians(ortho_bisector.coords_.c_[1] - 1.5707963267948966,ABS(lng));
    local_40 = SVar2.coords_.c_[0];
    local_38 = SVar2.coords_.c_[1];
    local_30 = (undefined1  [8])local_40;
    ortho_bisector.coords_.c_[0] = local_38;
  }
  if (GetBisectorIntersection(R1Interval_const&,double)::ortho_lng == '\0') {
    iVar1 = __cxa_guard_acquire(&GetBisectorIntersection(R1Interval_const&,double)::ortho_lng);
    if (iVar1 != 0) {
      Vector3<double>::Vector3(&GetBisectorIntersection::ortho_lng,0.0,-1.0,0.0);
      __cxa_guard_release(&GetBisectorIntersection(R1Interval_const&,double)::ortho_lng);
    }
  }
  S2LatLng::ToPoint(&local_78,(S2LatLng *)local_30);
  S2::RobustCrossProd(__return_storage_ptr__,&GetBisectorIntersection::ortho_lng,&local_78);
  return __return_storage_ptr__;
}

Assistant:

S2Point S2LatLngRect::GetBisectorIntersection(const R1Interval& lat,
                                              double lng) {
  lng = fabs(lng);
  double lat_center = lat.GetCenter();
  // A vector orthogonal to the bisector of the given longitudinal edge.
  S2LatLng ortho_bisector;
  if (lat_center >= 0) {
    ortho_bisector = S2LatLng::FromRadians(lat_center - M_PI_2, lng);
  } else {
    ortho_bisector = S2LatLng::FromRadians(-lat_center - M_PI_2, lng - M_PI);
  }
  // A vector orthogonal to longitude 0.
  static const S2Point ortho_lng = S2Point(0, -1, 0);
  return S2::RobustCrossProd(ortho_lng, ortho_bisector.ToPoint());
}